

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O3

ArrayFeatureType_Shape * __thiscall
CoreML::Specification::ArrayFeatureType_Shape::New(ArrayFeatureType_Shape *this,Arena *arena)

{
  ArrayFeatureType_Shape *this_00;
  
  this_00 = (ArrayFeatureType_Shape *)operator_new(0x28);
  ArrayFeatureType_Shape(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::ArrayFeatureType_Shape>(arena,this_00);
  }
  return this_00;
}

Assistant:

ArrayFeatureType_Shape* ArrayFeatureType_Shape::New(::google::protobuf::Arena* arena) const {
  ArrayFeatureType_Shape* n = new ArrayFeatureType_Shape;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}